

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_label_name_test.cc
# Opt level: O0

int prometheus::anon_unknown_0::CheckLabelNameTest_leading_invalid_label_name_Test::AddToRegistry
              (void)

{
  UnitTest *this;
  ParameterizedTestSuiteRegistry *this_00;
  ParameterizedTestSuiteInfo<prometheus::(anonymous_namespace)::CheckLabelNameTest> *this_01;
  TestMetaFactoryBase<prometheus::MetricType> *meta_factory;
  allocator local_b1;
  string local_b0;
  CodeLocation local_90;
  allocator local_51;
  string local_50;
  CodeLocation local_30;
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/check_label_name_test.cc"
             ,&local_51);
  testing::internal::CodeLocation::CodeLocation(&local_30,&local_50,0x18);
  this_01 = testing::internal::ParameterizedTestSuiteRegistry::
            GetTestSuitePatternHolder<prometheus::(anonymous_namespace)::CheckLabelNameTest>
                      (this_00,"CheckLabelNameTest",&local_30);
  meta_factory = (TestMetaFactoryBase<prometheus::MetricType> *)operator_new(8);
  testing::internal::
  TestMetaFactory<prometheus::(anonymous_namespace)::CheckLabelNameTest_leading_invalid_label_name_Test>
  ::TestMetaFactory((TestMetaFactory<prometheus::(anonymous_namespace)::CheckLabelNameTest_leading_invalid_label_name_Test>
                     *)meta_factory);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/check_label_name_test.cc"
             ,&local_b1);
  testing::internal::CodeLocation::CodeLocation(&local_90,&local_b0,0x18);
  testing::internal::
  ParameterizedTestSuiteInfo<prometheus::(anonymous_namespace)::CheckLabelNameTest>::AddTestPattern
            (this_01,"CheckLabelNameTest","leading_invalid_label_name",meta_factory,&local_90);
  testing::internal::CodeLocation::~CodeLocation(&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  testing::internal::CodeLocation::~CodeLocation(&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return 0;
}

Assistant:

TEST_P(CheckLabelNameTest, leading_invalid_label_name) {
  EXPECT_FALSE(CheckLabelName("-abcd"));
}